

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<prometheus::MetricType> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  ParamGenerator<prometheus::MetricType> PVar1;
  vector<prometheus::MetricType,_std::allocator<prometheus::MetricType>_> local_30;
  ValueArray<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>
  *this_local;
  
  this_local = (ValueArray<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>
                *)this;
  ValueArray<prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType>
  ::MakeVector<prometheus::MetricType,0ul,1ul,2ul,3ul,4ul,5ul>(&local_30,in_RSI);
  ValuesIn<std::vector<prometheus::MetricType,std::allocator<prometheus::MetricType>>>
            ((testing *)this,&local_30);
  std::vector<prometheus::MetricType,_std::allocator<prometheus::MetricType>_>::~vector(&local_30);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<prometheus::MetricType>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }